

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.h
# Opt level: O3

int __thiscall pbrt::NanoVDBBuffer::init(NanoVDBBuffer *this,EVP_PKEY_CTX *ctx)

{
  memory_resource *pmVar1;
  int iVar2;
  EVP_PKEY_CTX *extraout_RAX;
  undefined4 extraout_var;
  EVP_PKEY_CTX *extraout_RAX_00;
  EVP_PKEY_CTX *extraout_RAX_01;
  string local_38;
  NanoVDBBuffer *local_18;
  EVP_PKEY_CTX *pEVar3;
  
  pEVar3 = (EVP_PKEY_CTX *)this->bytesAllocated;
  if (pEVar3 != ctx) {
    if (pEVar3 != (EVP_PKEY_CTX *)0x0) {
      clear(this);
      pEVar3 = extraout_RAX;
    }
    if (ctx != (EVP_PKEY_CTX *)0x0) {
      this->bytesAllocated = (size_t)ctx;
      pmVar1 = (this->alloc).memoryResource;
      iVar2 = (*pmVar1->_vptr_memory_resource[2])(pmVar1,ctx,0x80);
      pEVar3 = (EVP_PKEY_CTX *)CONCAT44(extraout_var,iVar2);
      this->ptr = (uint8_t *)pEVar3;
      if (LOGGING_LogLevel < 1) {
        local_38._M_string_length = 0;
        local_38.field_2._M_local_buf[0] = '\0';
        local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
        local_18 = this;
        detail::stringPrintfRecursive<pbrt::NanoVDBBuffer*,unsigned_char*&,unsigned_long&>
                  (&local_38,"this %p alloc ptr %p bytes %d",&local_18,&this->ptr,
                   &this->bytesAllocated);
        Log(Verbose,
            "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/media.h"
            ,0x212,local_38._M_dataplus._M_p);
        pEVar3 = extraout_RAX_00;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_38._M_dataplus._M_p != &local_38.field_2) {
          operator_delete(local_38._M_dataplus._M_p,
                          CONCAT71(local_38.field_2._M_allocated_capacity._1_7_,
                                   local_38.field_2._M_local_buf[0]) + 1);
          pEVar3 = extraout_RAX_01;
        }
      }
    }
  }
  return (int)pEVar3;
}

Assistant:

void init(uint64_t size) {
        if (size == bytesAllocated)
            return;
        if (bytesAllocated > 0)
            clear();
        if (size == 0)
            return;
        bytesAllocated = size;
        ptr = (uint8_t *)alloc.allocate_bytes(bytesAllocated, 128);
        LOG_VERBOSE("this %p alloc ptr %p bytes %d", this, ptr, bytesAllocated);
    }